

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O0

void printInt32Bang(SStream *O,int32_t val)

{
  int32_t val_local;
  SStream *O_local;
  
  if (val < 0) {
    if (val < -9) {
      SStream_concat(O,"#-0x%x",(ulong)(uint)-val);
    }
    else {
      SStream_concat(O,"#-%u",(ulong)(uint)-val);
    }
  }
  else if (val < 10) {
    SStream_concat(O,"#%u",(ulong)(uint)val);
  }
  else {
    SStream_concat(O,"#0x%x",(ulong)(uint)val);
  }
  return;
}

Assistant:

void printInt32Bang(SStream *O, int32_t val)
{
	if (val >= 0) {
		if (val > HEX_THRESHOLD)
			SStream_concat(O, "#0x%x", val);
		else
			SStream_concat(O, "#%u", val);
	} else {
		if (val <- HEX_THRESHOLD)
			SStream_concat(O, "#-0x%x", -val);
		else
			SStream_concat(O, "#-%u", -val);
	}
}